

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O3

int unit_cmp_exact(void)

{
  long lVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((UnitsOn == '\x01') && (iVar2 = 1, unitonflag != 0)) && (usp[-1].dim[0] != '\t')) &&
     (usp->dim[0] != '\t')) {
    lVar1 = -0x10;
    do {
      if (usp->dim[lVar1 + -8] != usp[1].dim[lVar1 + -8]) goto LAB_00118311;
      lVar1 = lVar1 + 1;
    } while (lVar1 != -6);
    if (1e-05 < ABS(usp->factor / usp[-1].factor + -1.0)) {
LAB_00118311:
      iVar2 = 0;
      if (fperrc != 0) {
        diag("underflow or overflow in units calculation",(char *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int
unit_cmp_exact() { /* returns 1 if top two units on stack are same */
	struct unit *up;
	int i;

	{if (!UnitsOn) return 0;}
	up = usp - 1;
   if (unitonflag) {
	if (up->dim[0] == 9 || usp->dim[0] == 9) {
		return 1;
	}
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			return 0;
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
		return 0;
	}
   }
	return 1;
}